

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  sqlite3 *db;
  WhereOrInfo *pWC_00;
  ushort uVar1;
  int iVar2;
  WhereTerm *pWVar3;
  
  db = pWC->pWInfo->pParse->db;
  pWVar3 = pWC->a;
  for (iVar2 = pWC->nTerm; 0 < iVar2; iVar2 = iVar2 + -1) {
    uVar1 = pWVar3->wtFlags;
    if ((uVar1 & 1) != 0) {
      sqlite3ExprDelete(db,pWVar3->pExpr);
      uVar1 = pWVar3->wtFlags;
    }
    if ((uVar1 & 0x30) != 0) {
      pWC_00 = (pWVar3->u).pOrInfo;
      sqlite3WhereClauseClear(&pWC_00->wc);
      sqlite3DbFree(db,pWC_00);
    }
    pWVar3 = pWVar3 + 1;
  }
  if (pWC->a != pWC->aStatic) {
    sqlite3DbFree(db,pWC->a);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  int i;
  WhereTerm *a;
  sqlite3 *db = pWC->pWInfo->pParse->db;
  for(i=pWC->nTerm-1, a=pWC->a; i>=0; i--, a++){
    if( a->wtFlags & TERM_DYNAMIC ){
      sqlite3ExprDelete(db, a->pExpr);
    }
    if( a->wtFlags & TERM_ORINFO ){
      whereOrInfoDelete(db, a->u.pOrInfo);
    }else if( a->wtFlags & TERM_ANDINFO ){
      whereAndInfoDelete(db, a->u.pAndInfo);
    }
  }
  if( pWC->a!=pWC->aStatic ){
    sqlite3DbFree(db, pWC->a);
  }
}